

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

int ngram_search_finish(ps_search_t *search)

{
  int iVar1;
  int iVar2;
  
  search[5].post = search[5].post + *(int *)((long)&search[3].type + 4);
  if (*(char *)&search[1].name == '\0') {
    if (*(char *)((long)&search[1].name + 1) == '\0') goto LAB_00136cf2;
  }
  else {
    ngram_fwdtree_finish((ngram_search_t *)search);
    if (*(char *)((long)&search[1].name + 1) == '\0') goto LAB_00136cf2;
    iVar1 = acmod_rewind(search->acmod);
    if (iVar1 < 0) {
      return -1;
    }
    ngram_fwdflat_start((ngram_search_t *)search);
    iVar1 = 0;
    while (0 < search->acmod->n_feat_frame) {
      iVar2 = ngram_fwdflat_search((ngram_search_t *)search,iVar1);
      if (iVar2 < 0) {
        return iVar2;
      }
      acmod_advance(search->acmod);
      iVar1 = iVar1 + 1;
    }
  }
  ngram_fwdflat_finish((ngram_search_t *)search);
LAB_00136cf2:
  *(undefined1 *)((long)&search[1].name + 3) = 1;
  return 0;
}

Assistant:

static int
ngram_search_finish(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    ngs->n_tot_frame += ngs->n_frame;
    if (ngs->fwdtree) {
        ngram_fwdtree_finish(ngs);
        /* dump_bptable(ngs); */

        /* Now do fwdflat search in its entirety, if requested. */
        if (ngs->fwdflat) {
            int i;
            /* Rewind the acoustic model. */
            if (acmod_rewind(ps_search_acmod(ngs)) < 0)
                return -1;
            /* Now redo search. */
            ngram_fwdflat_start(ngs);
            i = 0;
            while (ps_search_acmod(ngs)->n_feat_frame > 0) {
                int nfr;
                if ((nfr = ngram_fwdflat_search(ngs, i)) < 0)
                    return nfr;
                acmod_advance(ps_search_acmod(ngs));
                ++i;
            }
            ngram_fwdflat_finish(ngs);
            /* And now, we should have a result... */
            /* dump_bptable(ngs); */
        }
    }
    else if (ngs->fwdflat) {
        ngram_fwdflat_finish(ngs);
    }

    /* Mark the current utterance as done. */
    ngs->done = TRUE;
    return 0;
}